

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int cm_zlib_deflateInit2_
              (z_streamp strm,int level,int method,int windowBits,int memLevel,int strategy,
              char *version,int stream_size)

{
  uint uVar1;
  byte bVar2;
  uInt uVar3;
  int iVar4;
  internal_state *piVar5;
  Bytef *pBVar6;
  Posf *pPVar7;
  int iVar8;
  uInt uVar9;
  uint uVar10;
  
  if (version == (char *)0x0) {
    return -6;
  }
  if (stream_size != 0x70) {
    return -6;
  }
  if (*version != '1') {
    return -6;
  }
  iVar4 = -2;
  if (strm == (z_streamp)0x0) {
    return -2;
  }
  strm->msg = (char *)0x0;
  if (strm->zalloc == (alloc_func)0x0) {
    strm->zalloc = cm_zlib_zcalloc;
    strm->opaque = (voidpf)0x0;
  }
  if (strm->zfree == (free_func)0x0) {
    strm->zfree = cm_zlib_zcfree;
  }
  uVar10 = 6;
  if (level != -1) {
    uVar10 = level;
  }
  if (windowBits < 0) {
    if (windowBits < -0xf) {
      return -2;
    }
    windowBits = -windowBits;
    iVar8 = 0;
  }
  else {
    if (windowBits < 0x10) {
      iVar8 = 1;
      bVar2 = 0;
      goto LAB_00802596;
    }
    windowBits = windowBits - 0x10;
    iVar8 = 2;
  }
  bVar2 = 1;
LAB_00802596:
  if ((((((uint)strategy < 5) && (uVar10 < 10)) && (method == 8)) &&
      ((0xfffffff6 < memLevel - 10U && (0xfffffff7 < windowBits - 0x10U)))) &&
     (!(bool)(windowBits == 8U & bVar2))) {
    piVar5 = (internal_state *)(*strm->zalloc)(strm->opaque,1,0x1740);
    iVar4 = -4;
    if (piVar5 != (internal_state *)0x0) {
      uVar3 = 9;
      if (windowBits != 8) {
        uVar3 = windowBits;
      }
      strm->state = piVar5;
      piVar5->strm = strm;
      piVar5->status = 0x2a;
      piVar5->wrap = iVar8;
      piVar5->gzhead = (gz_headerp)0x0;
      piVar5->w_bits = uVar3;
      uVar9 = 1 << ((byte)uVar3 & 0x1f);
      piVar5->w_size = uVar9;
      piVar5->w_mask = uVar9 - 1;
      uVar3 = 0x80 << ((byte)memLevel & 0x1f);
      piVar5->hash_bits = memLevel + 7;
      piVar5->hash_size = uVar3;
      piVar5->hash_mask = uVar3 - 1;
      piVar5->hash_shift = (memLevel + 9U) / 3;
      pBVar6 = (Bytef *)(*strm->zalloc)(strm->opaque,uVar9,2);
      piVar5->window = pBVar6;
      memset(pBVar6,0,(ulong)(piVar5->w_size * 2));
      pPVar7 = (Posf *)(*strm->zalloc)(strm->opaque,piVar5->w_size,2);
      piVar5->prev = pPVar7;
      pPVar7 = (Posf *)(*strm->zalloc)(strm->opaque,piVar5->hash_size,2);
      uVar3 = 0x40 << ((byte)memLevel & 0x1f);
      piVar5->head = pPVar7;
      piVar5->high_water = 0;
      piVar5->lit_bufsize = uVar3;
      pBVar6 = (Bytef *)(*strm->zalloc)(strm->opaque,uVar3,4);
      piVar5->pending_buf = pBVar6;
      uVar1 = piVar5->lit_bufsize;
      piVar5->pending_buf_size = (ulong)uVar1 * 4;
      if (((piVar5->window != (Bytef *)0x0) && (piVar5->prev != (Posf *)0x0)) &&
         (pBVar6 != (Bytef *)0x0 && piVar5->head != (Posf *)0x0)) {
        piVar5->sym_buf = pBVar6 + uVar1;
        piVar5->sym_end = uVar1 * 3 - 3;
        piVar5->level = uVar10;
        piVar5->strategy = strategy;
        piVar5->method = '\b';
        iVar4 = cm_zlib_deflateReset(strm);
        return iVar4;
      }
      piVar5->status = 0x29a;
      strm->msg = "insufficient memory";
      cm_zlib_deflateEnd(strm);
    }
  }
  return iVar4;
}

Assistant:

int ZEXPORT deflateInit2_(z_streamp strm, int level, int method,
                          int windowBits, int memLevel, int strategy,
                          const char *version, int stream_size) {
    deflate_state *s;
    int wrap = 1;
    static const char my_version[] = ZLIB_VERSION;

    if (version == Z_NULL || version[0] != my_version[0] ||
        stream_size != sizeof(z_stream)) {
        return Z_VERSION_ERROR;
    }
    if (strm == Z_NULL) return Z_STREAM_ERROR;

    strm->msg = Z_NULL;
    if (strm->zalloc == (alloc_func)0) {
#ifdef Z_SOLO
        return Z_STREAM_ERROR;
#else
        strm->zalloc = zcalloc;
        strm->opaque = (voidpf)0;
#endif
    }
    if (strm->zfree == (free_func)0)
#ifdef Z_SOLO
        return Z_STREAM_ERROR;
#else
        strm->zfree = zcfree;
#endif

#ifdef FASTEST
    if (level != 0) level = 1;
#else
    if (level == Z_DEFAULT_COMPRESSION) level = 6;
#endif

    if (windowBits < 0) { /* suppress zlib wrapper */
        wrap = 0;
        if (windowBits < -15)
            return Z_STREAM_ERROR;
        windowBits = -windowBits;
    }
#ifdef GZIP
    else if (windowBits > 15) {
        wrap = 2;       /* write gzip wrapper instead */
        windowBits -= 16;
    }
#endif
    if (memLevel < 1 || memLevel > MAX_MEM_LEVEL || method != Z_DEFLATED ||
        windowBits < 8 || windowBits > 15 || level < 0 || level > 9 ||
        strategy < 0 || strategy > Z_FIXED || (windowBits == 8 && wrap != 1)) {
        return Z_STREAM_ERROR;
    }
    if (windowBits == 8) windowBits = 9;  /* until 256-byte window bug fixed */
    s = (deflate_state *) ZALLOC(strm, 1, sizeof(deflate_state));
    if (s == Z_NULL) return Z_MEM_ERROR;
    strm->state = (struct internal_state FAR *)s;
    s->strm = strm;
    s->status = INIT_STATE;     /* to pass state test in deflateReset() */

    s->wrap = wrap;
    s->gzhead = Z_NULL;
    s->w_bits = (uInt)windowBits;
    s->w_size = 1 << s->w_bits;
    s->w_mask = s->w_size - 1;

    s->hash_bits = (uInt)memLevel + 7;
    s->hash_size = 1 << s->hash_bits;
    s->hash_mask = s->hash_size - 1;
    s->hash_shift =  ((s->hash_bits + MIN_MATCH-1) / MIN_MATCH);

    s->window = (Bytef *) ZALLOC(strm, s->w_size, 2*sizeof(Byte));

    /* The following memset eliminates the valgrind uninitialized warning
      "swept under the carpet" here:
      http://www.zlib.net/zlib_faq.html#faq36 */

    memset(s->window, 0, s->w_size*2*sizeof(Byte));

    s->prev   = (Posf *)  ZALLOC(strm, s->w_size, sizeof(Pos));
    s->head   = (Posf *)  ZALLOC(strm, s->hash_size, sizeof(Pos));

    s->high_water = 0;      /* nothing written to s->window yet */

    s->lit_bufsize = 1 << (memLevel + 6); /* 16K elements by default */

    /* We overlay pending_buf and sym_buf. This works since the average size
     * for length/distance pairs over any compressed block is assured to be 31
     * bits or less.
     *
     * Analysis: The longest fixed codes are a length code of 8 bits plus 5
     * extra bits, for lengths 131 to 257. The longest fixed distance codes are
     * 5 bits plus 13 extra bits, for distances 16385 to 32768. The longest
     * possible fixed-codes length/distance pair is then 31 bits total.
     *
     * sym_buf starts one-fourth of the way into pending_buf. So there are
     * three bytes in sym_buf for every four bytes in pending_buf. Each symbol
     * in sym_buf is three bytes -- two for the distance and one for the
     * literal/length. As each symbol is consumed, the pointer to the next
     * sym_buf value to read moves forward three bytes. From that symbol, up to
     * 31 bits are written to pending_buf. The closest the written pending_buf
     * bits gets to the next sym_buf symbol to read is just before the last
     * code is written. At that time, 31*(n - 2) bits have been written, just
     * after 24*(n - 2) bits have been consumed from sym_buf. sym_buf starts at
     * 8*n bits into pending_buf. (Note that the symbol buffer fills when n - 1
     * symbols are written.) The closest the writing gets to what is unread is
     * then n + 14 bits. Here n is lit_bufsize, which is 16384 by default, and
     * can range from 128 to 32768.
     *
     * Therefore, at a minimum, there are 142 bits of space between what is
     * written and what is read in the overlain buffers, so the symbols cannot
     * be overwritten by the compressed data. That space is actually 139 bits,
     * due to the three-bit fixed-code block header.
     *
     * That covers the case where either Z_FIXED is specified, forcing fixed
     * codes, or when the use of fixed codes is chosen, because that choice
     * results in a smaller compressed block than dynamic codes. That latter
     * condition then assures that the above analysis also covers all dynamic
     * blocks. A dynamic-code block will only be chosen to be emitted if it has
     * fewer bits than a fixed-code block would for the same set of symbols.
     * Therefore its average symbol length is assured to be less than 31. So
     * the compressed data for a dynamic block also cannot overwrite the
     * symbols from which it is being constructed.
     */

    s->pending_buf = (uchf *) ZALLOC(strm, s->lit_bufsize, LIT_BUFS);
    s->pending_buf_size = (ulg)s->lit_bufsize * 4;

    if (s->window == Z_NULL || s->prev == Z_NULL || s->head == Z_NULL ||
        s->pending_buf == Z_NULL) {
        s->status = FINISH_STATE;
        strm->msg = ERR_MSG(Z_MEM_ERROR);
        deflateEnd (strm);
        return Z_MEM_ERROR;
    }
#ifdef LIT_MEM
    s->d_buf = (ushf *)(s->pending_buf + (s->lit_bufsize << 1));
    s->l_buf = s->pending_buf + (s->lit_bufsize << 2);
    s->sym_end = s->lit_bufsize - 1;
#else
    s->sym_buf = s->pending_buf + s->lit_bufsize;
    s->sym_end = (s->lit_bufsize - 1) * 3;
#endif
    /* We avoid equality with lit_bufsize*3 because of wraparound at 64K
     * on 16 bit machines and because stored blocks are restricted to
     * 64K-1 bytes.
     */

    s->level = level;
    s->strategy = strategy;
    s->method = (Byte)method;

    return deflateReset(strm);
}